

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O2

int run_test_tcp_bind_error_inval(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  sockaddr_in addr2;
  sockaddr_in addr1;
  uv_tcp_t server;
  sockaddr_in sStack_118;
  sockaddr_in local_108;
  uv_tcp_t local_f8;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&local_108);
  if (iVar1 == 0) {
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a4,&sStack_118);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_tcp_init(puVar2,&local_f8);
      if (iVar1 == 0) {
        iVar1 = uv_tcp_bind(&local_f8,(sockaddr *)&local_108,0);
        if (iVar1 == 0) {
          iVar1 = uv_tcp_bind(&local_f8,(sockaddr *)&sStack_118,0);
          if (iVar1 == -0x16) {
            uv_close((uv_handle_t *)&local_f8,close_cb);
            puVar2 = uv_default_loop();
            uv_run(puVar2,UV_RUN_DEFAULT);
            if (close_cb_called == 1) {
              puVar2 = uv_default_loop();
              close_loop(puVar2);
              puVar2 = uv_default_loop();
              iVar1 = uv_loop_close(puVar2);
              if (iVar1 == 0) {
                return 0;
              }
              pcVar4 = "0 == uv_loop_close(uv_default_loop())";
              uVar3 = 0xa6;
            }
            else {
              pcVar4 = "close_cb_called == 1";
              uVar3 = 0xa4;
            }
          }
          else {
            pcVar4 = "r == UV_EINVAL";
            uVar3 = 0x9e;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0x9c;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0x9a;
      }
    }
    else {
      pcVar4 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT_2, &addr2)";
      uVar3 = 0x97;
    }
  }
  else {
    pcVar4 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr1)";
    uVar3 = 0x96;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind-error.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(tcp_bind_error_inval) {
  struct sockaddr_in addr1;
  struct sockaddr_in addr2;
  uv_tcp_t server;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr1));
  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT_2, &addr2));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr1, 0);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr2, 0);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}